

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmwrtimg.cpp
# Opt level: O0

void __thiscall
CVmImageWriter::fix_pool_def(CVmImageWriter *this,long def_seek_ofs,uint32_t page_count)

{
  CVmFile *this_00;
  uint in_EDX;
  CVmFile *in_RDI;
  char buf [4];
  long old_pos;
  long in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd8;
  
  this_00 = (CVmFile *)CVmFile::get_pos(in_RDI);
  CVmFile::set_pos(in_RDI,in_stack_ffffffffffffffc8);
  ::oswp4(&stack0xffffffffffffffdc,(ulong)in_EDX);
  CVmFile::write_bytes(this_00,in_stack_ffffffffffffffd8,(size_t)in_RDI);
  CVmFile::set_pos(in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void CVmImageWriter::fix_pool_def(long def_seek_ofs, uint32_t page_count)
{
    long old_pos;
    char buf[4];

    /* note the file position at entry */
    old_pos = fp_->get_pos();
    
    /* 
     *   seek to the original definition block location, plus the size of
     *   the block header (10 bytes), plus the offset within the block of
     *   the pool page count (it starts 2 bytes into the block data) 
     */
    fp_->set_pos(def_seek_ofs + 10 + 2);

    /* write the page count */
    oswp4(buf, page_count);
    fp_->write_bytes(buf, 4);

    /* seek back to our location at entry */
    fp_->set_pos(old_pos);
}